

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkLayerValidator.cpp
# Opt level: O1

Result * __thiscall
CoreML::NeuralNetworkSpecValidator::validatePooling3dLayer
          (Result *__return_storage_ptr__,NeuralNetworkSpecValidator *this,NeuralNetworkLayer *layer
          )

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  bool bVar4;
  LayerUnion from;
  Result *_result;
  Pooling3DLayerParams pooling3d;
  string local_c0;
  undefined1 local_a0 [32];
  int local_80;
  int local_7c;
  int local_78;
  int local_74;
  int local_70;
  int local_6c;
  int local_68;
  int local_64;
  int local_60;
  Pooling3DLayerParams_Pooling3DPaddingType local_58;
  string local_50;
  
  validateInputCount(__return_storage_ptr__,layer,1,1);
  bVar4 = Result::good(__return_storage_ptr__);
  if (bVar4) {
    pcVar3 = (__return_storage_ptr__->m_message)._M_dataplus._M_p;
    paVar1 = &(__return_storage_ptr__->m_message).field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar3 != paVar1) {
      operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
    }
    if (bVar4) {
      validateOutputCount(__return_storage_ptr__,layer,1,1);
      bVar4 = Result::good(__return_storage_ptr__);
      if (bVar4) {
        pcVar3 = (__return_storage_ptr__->m_message)._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)pcVar3 != paVar1) {
          operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
        }
        if (bVar4) {
          if (this->ndArrayInterpretation == true) {
            local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"Pooling3d","");
            validateInputOutputRankEquality
                      (__return_storage_ptr__,layer,&local_50,&this->blobNameToRank);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_50._M_dataplus._M_p != &local_50.field_2) {
              operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
            }
            bVar4 = Result::good(__return_storage_ptr__);
            if (!bVar4) {
              return __return_storage_ptr__;
            }
            pcVar3 = (__return_storage_ptr__->m_message)._M_dataplus._M_p;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)pcVar3 != paVar1) {
              operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
            }
            if (!bVar4) {
              return __return_storage_ptr__;
            }
            local_a0._0_8_ = local_a0 + 0x10;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_a0,"Pooling3d","");
            validateRankCount(__return_storage_ptr__,layer,(string *)local_a0,5,-1,
                              &this->blobNameToRank);
            if ((undefined1 *)local_a0._0_8_ != local_a0 + 0x10) {
              operator_delete((void *)local_a0._0_8_,CONCAT44(local_a0._20_4_,local_a0._16_4_) + 1);
            }
            bVar4 = Result::good(__return_storage_ptr__);
            if (!bVar4) {
              return __return_storage_ptr__;
            }
            pcVar3 = (__return_storage_ptr__->m_message)._M_dataplus._M_p;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)pcVar3 != paVar1) {
              operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
            }
            if (!bVar4) {
              return __return_storage_ptr__;
            }
          }
          if (layer->_oneof_case_[0] == 0x5b9) {
            from = layer->layer_;
          }
          else {
            from.pooling3d_ = Specification::Pooling3DLayerParams::default_instance();
          }
          Specification::Pooling3DLayerParams::Pooling3DLayerParams
                    ((Pooling3DLayerParams *)local_a0,from.pooling3d_);
          paVar2 = &local_c0.field_2;
          local_c0._M_dataplus._M_p = (pointer)paVar2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"Kernel Depth","");
          validatePositive(__return_storage_ptr__,local_a0._20_4_,&local_c0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_c0._M_dataplus._M_p != paVar2) {
            operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
          }
          bVar4 = Result::good(__return_storage_ptr__);
          if (bVar4) {
            pcVar3 = (__return_storage_ptr__->m_message)._M_dataplus._M_p;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)pcVar3 != paVar1) {
              operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
            }
            local_c0._M_dataplus._M_p = (pointer)paVar2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"Kernel Height","");
            validatePositive(__return_storage_ptr__,local_a0._24_4_,&local_c0);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_c0._M_dataplus._M_p != paVar2) {
              operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
            }
            bVar4 = Result::good(__return_storage_ptr__);
            if (bVar4) {
              pcVar3 = (__return_storage_ptr__->m_message)._M_dataplus._M_p;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)pcVar3 != paVar1) {
                operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
              }
              local_c0._M_dataplus._M_p = (pointer)paVar2;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"Kernel Width","")
              ;
              validatePositive(__return_storage_ptr__,local_a0._28_4_,&local_c0);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_c0._M_dataplus._M_p != paVar2) {
                operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1
                               );
              }
              bVar4 = Result::good(__return_storage_ptr__);
              if (bVar4) {
                pcVar3 = (__return_storage_ptr__->m_message)._M_dataplus._M_p;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)pcVar3 != paVar1) {
                  operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
                }
                local_c0._M_dataplus._M_p = (pointer)paVar2;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_c0,"Stride Depth","");
                validatePositive(__return_storage_ptr__,local_80,&local_c0);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_c0._M_dataplus._M_p != paVar2) {
                  operator_delete(local_c0._M_dataplus._M_p,
                                  local_c0.field_2._M_allocated_capacity + 1);
                }
                bVar4 = Result::good(__return_storage_ptr__);
                if (bVar4) {
                  pcVar3 = (__return_storage_ptr__->m_message)._M_dataplus._M_p;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)pcVar3 != paVar1) {
                    operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
                  }
                  local_c0._M_dataplus._M_p = (pointer)paVar2;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)&local_c0,"Stride Height","");
                  validatePositive(__return_storage_ptr__,local_7c,&local_c0);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_c0._M_dataplus._M_p != paVar2) {
                    operator_delete(local_c0._M_dataplus._M_p,
                                    local_c0.field_2._M_allocated_capacity + 1);
                  }
                  bVar4 = Result::good(__return_storage_ptr__);
                  if (bVar4) {
                    pcVar3 = (__return_storage_ptr__->m_message)._M_dataplus._M_p;
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)pcVar3 != paVar1) {
                      operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
                    }
                    local_c0._M_dataplus._M_p = (pointer)paVar2;
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)&local_c0,"Stride Width","");
                    validatePositive(__return_storage_ptr__,local_78,&local_c0);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_c0._M_dataplus._M_p != paVar2) {
                      operator_delete(local_c0._M_dataplus._M_p,
                                      local_c0.field_2._M_allocated_capacity + 1);
                    }
                    bVar4 = Result::good(__return_storage_ptr__);
                    if (bVar4) {
                      pcVar3 = (__return_storage_ptr__->m_message)._M_dataplus._M_p;
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)pcVar3 != paVar1) {
                        operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
                      }
                      local_c0._M_dataplus._M_p = (pointer)paVar2;
                      std::__cxx11::string::_M_construct<char_const*>
                                ((string *)&local_c0,"Front","");
                      validatePooling3dPadding(__return_storage_ptr__,local_58,local_74,&local_c0);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_c0._M_dataplus._M_p != paVar2) {
                        operator_delete(local_c0._M_dataplus._M_p,
                                        local_c0.field_2._M_allocated_capacity + 1);
                      }
                      bVar4 = Result::good(__return_storage_ptr__);
                      if (bVar4) {
                        pcVar3 = (__return_storage_ptr__->m_message)._M_dataplus._M_p;
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)pcVar3 != paVar1) {
                          operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
                        }
                        local_c0._M_dataplus._M_p = (pointer)paVar2;
                        std::__cxx11::string::_M_construct<char_const*>
                                  ((string *)&local_c0,"Back","");
                        validatePooling3dPadding(__return_storage_ptr__,local_58,local_70,&local_c0)
                        ;
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_c0._M_dataplus._M_p != paVar2) {
                          operator_delete(local_c0._M_dataplus._M_p,
                                          local_c0.field_2._M_allocated_capacity + 1);
                        }
                        bVar4 = Result::good(__return_storage_ptr__);
                        if (bVar4) {
                          pcVar3 = (__return_storage_ptr__->m_message)._M_dataplus._M_p;
                          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)pcVar3 != paVar1) {
                            operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
                          }
                          local_c0._M_dataplus._M_p = (pointer)paVar2;
                          std::__cxx11::string::_M_construct<char_const*>
                                    ((string *)&local_c0,"Top","");
                          validatePooling3dPadding
                                    (__return_storage_ptr__,local_58,local_6c,&local_c0);
                          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_c0._M_dataplus._M_p != paVar2) {
                            operator_delete(local_c0._M_dataplus._M_p,
                                            local_c0.field_2._M_allocated_capacity + 1);
                          }
                          bVar4 = Result::good(__return_storage_ptr__);
                          if (bVar4) {
                            pcVar3 = (__return_storage_ptr__->m_message)._M_dataplus._M_p;
                            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)pcVar3 != paVar1) {
                              operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
                            }
                            local_c0._M_dataplus._M_p = (pointer)paVar2;
                            std::__cxx11::string::_M_construct<char_const*>
                                      ((string *)&local_c0,"Bottom","");
                            validatePooling3dPadding
                                      (__return_storage_ptr__,local_58,local_68,&local_c0);
                            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)local_c0._M_dataplus._M_p != paVar2) {
                              operator_delete(local_c0._M_dataplus._M_p,
                                              local_c0.field_2._M_allocated_capacity + 1);
                            }
                            bVar4 = Result::good(__return_storage_ptr__);
                            if (bVar4) {
                              pcVar3 = (__return_storage_ptr__->m_message)._M_dataplus._M_p;
                              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                   *)pcVar3 != paVar1) {
                                operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
                              }
                              local_c0._M_dataplus._M_p = (pointer)paVar2;
                              std::__cxx11::string::_M_construct<char_const*>
                                        ((string *)&local_c0,"Left","");
                              validatePooling3dPadding
                                        (__return_storage_ptr__,local_58,local_64,&local_c0);
                              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                   *)local_c0._M_dataplus._M_p != paVar2) {
                                operator_delete(local_c0._M_dataplus._M_p,
                                                local_c0.field_2._M_allocated_capacity + 1);
                              }
                              bVar4 = Result::good(__return_storage_ptr__);
                              if (bVar4) {
                                pcVar3 = (__return_storage_ptr__->m_message)._M_dataplus._M_p;
                                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                     *)pcVar3 != paVar1) {
                                  operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
                                }
                                local_c0._M_dataplus._M_p = (pointer)paVar2;
                                std::__cxx11::string::_M_construct<char_const*>
                                          ((string *)&local_c0,"Right","");
                                validatePooling3dPadding
                                          (__return_storage_ptr__,local_58,local_60,&local_c0);
                                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                     *)local_c0._M_dataplus._M_p != paVar2) {
                                  operator_delete(local_c0._M_dataplus._M_p,
                                                  local_c0.field_2._M_allocated_capacity + 1);
                                }
                                bVar4 = Result::good(__return_storage_ptr__);
                                if (bVar4) {
                                  pcVar3 = (__return_storage_ptr__->m_message)._M_dataplus._M_p;
                                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                       *)pcVar3 != paVar1) {
                                    operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
                                  }
                                  Result::Result(__return_storage_ptr__);
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
          Specification::Pooling3DLayerParams::~Pooling3DLayerParams
                    ((Pooling3DLayerParams *)local_a0);
        }
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Result NeuralNetworkSpecValidator::validatePooling3dLayer(const Specification::NeuralNetworkLayer& layer) {
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateInputCount(layer, 1, 1));
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateOutputCount(layer, 1, 1))
    
    if (ndArrayInterpretation) {
        HANDLE_RESULT_AND_RETURN_ON_ERROR(validateInputOutputRankEquality(layer, "Pooling3d", blobNameToRank));

        // Rank 5 for 2 spacial dimensions, 1 temporal dimension, batch dimension, and 1+ channels.
        HANDLE_RESULT_AND_RETURN_ON_ERROR(validateRankCount(layer, "Pooling3d", 5, -1, blobNameToRank));
    }
    
    // Kernel
    const auto pooling3d = layer.pooling3d();
   
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validatePositive(pooling3d.kerneldepth(), "Kernel Depth"));
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validatePositive(pooling3d.kernelheight(), "Kernel Height"));
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validatePositive(pooling3d.kernelwidth(), "Kernel Width"));

    // Stride
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validatePositive(pooling3d.stridedepth(), "Stride Depth"));
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validatePositive(pooling3d.strideheight(), "Stride Height"));
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validatePositive(pooling3d.stridewidth(), "Stride Width"));
    
    // Custom Padding
    auto paddingType = pooling3d.paddingtype();
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validatePooling3dPadding(paddingType, pooling3d.custompaddingfront(), "Front"));
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validatePooling3dPadding(paddingType, pooling3d.custompaddingback(), "Back"));
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validatePooling3dPadding(paddingType, pooling3d.custompaddingtop(), "Top"));
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validatePooling3dPadding(paddingType, pooling3d.custompaddingbottom(), "Bottom"));
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validatePooling3dPadding(paddingType, pooling3d.custompaddingleft(), "Left"));
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validatePooling3dPadding(paddingType, pooling3d.custompaddingright(), "Right"));
    
    return Result();
}